

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O3

void cftmdl(size_t n,size_t l,float *a,float *w)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  uVar3 = l * 4;
  if (l != 0) {
    uVar10 = 0;
    do {
      fVar22 = (float)*(undefined8 *)(a + uVar10);
      fVar23 = (float)((ulong)*(undefined8 *)(a + uVar10) >> 0x20);
      fVar24 = (float)*(undefined8 *)(a + l + uVar10);
      fVar20 = fVar22 + fVar24;
      fVar18 = (float)((ulong)*(undefined8 *)(a + l + uVar10) >> 0x20);
      fVar21 = fVar23 + fVar18;
      fVar22 = fVar22 - fVar24;
      fVar23 = fVar23 - fVar18;
      fVar24 = (float)*(undefined8 *)(a + l * 2 + uVar10);
      fVar25 = (float)((ulong)*(undefined8 *)(a + l * 2 + uVar10) >> 0x20);
      fVar26 = (float)*(undefined8 *)(a + l * 3 + uVar10);
      fVar18 = fVar24 - fVar26;
      fVar27 = (float)((ulong)*(undefined8 *)(a + l * 3 + uVar10) >> 0x20);
      fVar19 = fVar25 - fVar27;
      fVar24 = fVar24 + fVar26;
      fVar25 = fVar25 + fVar27;
      *(ulong *)(a + uVar10) = CONCAT44(fVar21 + fVar25,fVar20 + fVar24);
      *(ulong *)(a + l * 2 + uVar10) = CONCAT44(fVar21 - fVar25,fVar20 - fVar24);
      a[l + uVar10] = fVar22 - fVar19;
      a[l + uVar10 + 1] = fVar23 + fVar18;
      a[l * 3 + uVar10] = fVar19 + fVar22;
      a[l * 3 + uVar10 + 1] = fVar23 - fVar18;
      uVar10 = uVar10 + 2;
    } while (uVar10 < l);
  }
  if (uVar3 < l * 5) {
    fVar24 = w[2];
    lVar12 = 0;
    do {
      fVar19 = a[l * 4 + lVar12 + 1] - a[l * 5 + lVar12 + 1];
      fVar20 = a[l * 6 + lVar12 + 1] - a[l * 7 + lVar12 + 1];
      fVar25 = a[l * 6 + lVar12] - a[l * 7 + lVar12];
      fVar21 = a[l * 5 + lVar12 + 1] + a[l * 4 + lVar12 + 1];
      fVar22 = a[l * 7 + lVar12] + a[l * 6 + lVar12];
      fVar18 = a[l * 4 + lVar12] - a[l * 5 + lVar12];
      fVar23 = a[l * 7 + lVar12 + 1] + a[l * 6 + lVar12 + 1];
      fVar26 = a[l * 5 + lVar12] + a[l * 4 + lVar12];
      *(ulong *)(a + l * 4 + lVar12) = CONCAT44(fVar21 + fVar23,fVar22 + fVar26);
      *(ulong *)(a + l * 6 + lVar12) = CONCAT44(fVar26 - fVar22,fVar23 - fVar21);
      fVar21 = fVar18 - fVar20;
      fVar22 = fVar19 + fVar25;
      a[l * 5 + lVar12] = (fVar21 - fVar22) * fVar24;
      a[l * 5 + lVar12 + 1] = (fVar22 + fVar21) * fVar24;
      fVar18 = fVar18 + fVar20;
      fVar25 = fVar25 - fVar19;
      a[l * 7 + lVar12] = (fVar25 - fVar18) * fVar24;
      a[l * 7 + lVar12 + 1] = (fVar25 + fVar18) * fVar24;
      lVar6 = uVar3 + lVar12;
      lVar12 = lVar12 + 2;
    } while (lVar6 + 2U < l * 5);
  }
  uVar10 = l * 8;
  if (uVar10 < n) {
    pfVar13 = a + l * 8;
    pfVar14 = a + l * 9;
    pfVar7 = a + l * 0xb;
    pfVar17 = a + l * 10;
    lVar12 = l * 0xc;
    pfVar15 = a + l * 0xc;
    pfVar16 = a + l * 0xd;
    pfVar8 = a + l * 0xf;
    pfVar4 = a + l * 0xe;
    lVar6 = 0;
    uVar11 = uVar10;
    do {
      lVar5 = lVar6 * 2;
      fVar24 = w[lVar6 + 2];
      fVar18 = w[lVar6 + 3];
      if (uVar11 < uVar11 + l) {
        fVar25 = w[lVar5 + 4];
        fVar19 = w[lVar5 + 5];
        fVar21 = (fVar18 + fVar18) * fVar25 - fVar19;
        fVar20 = fVar25 - (fVar18 + fVar18) * fVar19;
        lVar9 = 0;
        do {
          fVar26 = (float)*(undefined8 *)(pfVar13 + lVar9);
          fVar27 = (float)((ulong)*(undefined8 *)(pfVar13 + lVar9) >> 0x20);
          fVar28 = (float)*(undefined8 *)(pfVar14 + lVar9);
          fVar32 = fVar26 + fVar28;
          fVar30 = (float)((ulong)*(undefined8 *)(pfVar14 + lVar9) >> 0x20);
          fVar33 = fVar27 + fVar30;
          fVar22 = (float)*(undefined8 *)(pfVar17 + lVar9);
          fVar23 = (float)((ulong)*(undefined8 *)(pfVar17 + lVar9) >> 0x20);
          fVar29 = (float)*(undefined8 *)(pfVar7 + lVar9);
          fVar34 = fVar22 + fVar29;
          fVar31 = (float)((ulong)*(undefined8 *)(pfVar7 + lVar9) >> 0x20);
          fVar35 = fVar23 + fVar31;
          *(ulong *)(pfVar13 + lVar9) = CONCAT44(fVar33 + fVar35,fVar32 + fVar34);
          fVar32 = fVar32 - fVar34;
          fVar33 = fVar33 - fVar35;
          *(ulong *)(pfVar17 + lVar9) =
               CONCAT44(fVar32 * fVar18 + fVar24 * fVar33,fVar33 * -fVar18 + fVar24 * fVar32);
          fVar26 = fVar26 - fVar28;
          fVar27 = fVar27 - fVar30;
          fVar22 = fVar22 - fVar29;
          fVar23 = fVar23 - fVar31;
          fVar28 = fVar26 - fVar23;
          fVar30 = fVar27 - fVar22;
          fVar23 = fVar23 + fVar26;
          fVar22 = fVar22 + fVar27;
          *(ulong *)(pfVar14 + lVar9) =
               CONCAT44(fVar28 * fVar19 + fVar22 * fVar25,fVar22 * -fVar19 + fVar28 * fVar25);
          *(ulong *)(pfVar7 + lVar9) =
               CONCAT44(fVar23 * fVar21 + fVar30 * fVar20,fVar30 * -fVar21 + fVar23 * fVar20);
          lVar1 = uVar11 + lVar9;
          lVar9 = lVar9 + 2;
        } while (lVar1 + 2U < uVar11 + l);
      }
      uVar2 = uVar3 + uVar11 + l;
      if (uVar3 + uVar11 < uVar2) {
        fVar25 = w[lVar5 + 6];
        fVar19 = w[lVar5 + 7];
        fVar21 = (fVar24 + fVar24) * fVar25 - fVar19;
        fVar20 = fVar25 - (fVar24 + fVar24) * fVar19;
        lVar5 = 0;
        do {
          fVar26 = (float)*(undefined8 *)(pfVar15 + lVar5);
          fVar27 = (float)((ulong)*(undefined8 *)(pfVar15 + lVar5) >> 0x20);
          fVar28 = (float)*(undefined8 *)(pfVar16 + lVar5);
          fVar32 = fVar26 + fVar28;
          fVar30 = (float)((ulong)*(undefined8 *)(pfVar16 + lVar5) >> 0x20);
          fVar33 = fVar27 + fVar30;
          fVar22 = (float)*(undefined8 *)(pfVar4 + lVar5);
          fVar23 = (float)((ulong)*(undefined8 *)(pfVar4 + lVar5) >> 0x20);
          fVar29 = (float)*(undefined8 *)(pfVar8 + lVar5);
          fVar34 = fVar22 + fVar29;
          fVar31 = (float)((ulong)*(undefined8 *)(pfVar8 + lVar5) >> 0x20);
          fVar35 = fVar23 + fVar31;
          *(ulong *)(pfVar15 + lVar5) = CONCAT44(fVar33 + fVar35,fVar32 + fVar34);
          fVar32 = fVar32 - fVar34;
          fVar33 = fVar33 - fVar35;
          *(ulong *)(pfVar4 + lVar5) =
               CONCAT44(fVar32 * fVar24 + -fVar18 * fVar33,fVar33 * -fVar24 + -fVar18 * fVar32);
          fVar26 = fVar26 - fVar28;
          fVar27 = fVar27 - fVar30;
          fVar22 = fVar22 - fVar29;
          fVar23 = fVar23 - fVar31;
          fVar28 = fVar26 - fVar23;
          fVar30 = fVar27 - fVar22;
          fVar23 = fVar23 + fVar26;
          fVar22 = fVar22 + fVar27;
          *(ulong *)(pfVar16 + lVar5) =
               CONCAT44(fVar28 * fVar19 + fVar22 * fVar25,fVar22 * -fVar19 + fVar28 * fVar25);
          *(ulong *)(pfVar8 + lVar5) =
               CONCAT44(fVar23 * fVar21 + fVar30 * fVar20,fVar30 * -fVar21 + fVar23 * fVar20);
          lVar9 = lVar12 + lVar5;
          lVar5 = lVar5 + 2;
        } while (lVar9 + 2U < uVar2);
      }
      lVar6 = lVar6 + 2;
      uVar11 = uVar11 + uVar10;
      pfVar13 = pfVar13 + l * 8;
      pfVar14 = pfVar14 + l * 8;
      pfVar7 = pfVar7 + l * 8;
      pfVar17 = pfVar17 + l * 8;
      lVar12 = lVar12 + uVar10;
      pfVar15 = pfVar15 + l * 8;
      pfVar16 = pfVar16 + l * 8;
      pfVar8 = pfVar8 + l * 8;
      pfVar4 = pfVar4 + l * 8;
    } while (uVar11 < n);
  }
  return;
}

Assistant:

static void cftmdl(size_t n, size_t l, float *a, float *w)
{
    size_t j, j1, j2, j3, k, k1, k2, m, m2;
    float wk1r, wk1i, wk2r, wk2i, wk3r, wk3i;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    m = l << 2;
    for (j = 0; j < l; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x0r - x2r;
        a[j2 + 1] = x0i - x2i;
        a[j1] = x1r - x3i;
        a[j1 + 1] = x1i + x3r;
        a[j3] = x1r + x3i;
        a[j3 + 1] = x1i - x3r;
    }
    wk1r = w[2];
    for (j = m; j < l + m; j += 2) {
        j1 = j + l;
        j2 = j1 + l;
        j3 = j2 + l;
        x0r = a[j] + a[j1];
        x0i = a[j + 1] + a[j1 + 1];
        x1r = a[j] - a[j1];
        x1i = a[j + 1] - a[j1 + 1];
        x2r = a[j2] + a[j3];
        x2i = a[j2 + 1] + a[j3 + 1];
        x3r = a[j2] - a[j3];
        x3i = a[j2 + 1] - a[j3 + 1];
        a[j] = x0r + x2r;
        a[j + 1] = x0i + x2i;
        a[j2] = x2i - x0i;
        a[j2 + 1] = x0r - x2r;
        x0r = x1r - x3i;
        x0i = x1i + x3r;
        a[j1] = wk1r * (x0r - x0i);
        a[j1 + 1] = wk1r * (x0r + x0i);
        x0r = x3i + x1r;
        x0i = x3r - x1i;
        a[j3] = wk1r * (x0i - x0r);
        a[j3 + 1] = wk1r * (x0i + x0r);
    }
    k1 = 0;
    m2 = 2 * m;
    for (k = m2; k < n; k += m2) {
        k1 += 2;
        k2 = 2 * k1;
        wk2r = w[k1];
        wk2i = w[k1 + 1];
        wk1r = w[k2];
        wk1i = w[k2 + 1];
        wk3r = wk1r - 2 * wk2i * wk1i;
        wk3i = 2 * wk2i * wk1r - wk1i;
        for (j = k; j < l + k; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = wk2r * x0r - wk2i * x0i;
            a[j2 + 1] = wk2r * x0i + wk2i * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
        wk1r = w[k2 + 2];
        wk1i = w[k2 + 3];
        wk3r = wk1r - 2 * wk2r * wk1i;
        wk3i = 2 * wk2r * wk1r - wk1i;
        for (j = k + m; j < l + (k + m); j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            x0r -= x2r;
            x0i -= x2i;
            a[j2] = -wk2i * x0r - wk2r * x0i;
            a[j2 + 1] = -wk2i * x0i + wk2r * x0r;
            x0r = x1r - x3i;
            x0i = x1i + x3r;
            a[j1] = wk1r * x0r - wk1i * x0i;
            a[j1 + 1] = wk1r * x0i + wk1i * x0r;
            x0r = x1r + x3i;
            x0i = x1i - x3r;
            a[j3] = wk3r * x0r - wk3i * x0i;
            a[j3 + 1] = wk3r * x0i + wk3i * x0r;
        }
    }
}